

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O0

string * __thiscall gmlc::networking::TcpAcceptor::to_string_abi_cxx11_(TcpAcceptor *this)

{
  address *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *str;
  undefined7 in_stack_ffffffffffffff78;
  char in_stack_ffffffffffffff7f;
  int in_stack_ffffffffffffffbc;
  
  asio::ip::basic_endpoint<asio::ip::tcp>::address
            ((basic_endpoint<asio::ip::tcp> *)
             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  asio::ip::address::to_string_abi_cxx11_(in_RSI);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_RDI,in_stack_ffffffffffffff7f);
  asio::ip::basic_endpoint<asio::ip::tcp>::port((basic_endpoint<asio::ip::tcp> *)0x70cea1);
  CLI::std::__cxx11::to_string(in_stack_ffffffffffffffbc);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  return (string *)in_RDI;
}

Assistant:

std::string TcpAcceptor::to_string() const
{
    auto str = endpoint_.address().to_string();
    str += ':';
    str += std::to_string(endpoint_.port());
    return str;
}